

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O0

string * test_uintwide_t_n_base::hexlexical_cast<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long *u)

{
  void *this;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  ulong *local_18;
  unsigned_long *u_local;
  
  local_18 = u;
  u_local = (unsigned_long *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this = (void *)std::ostream::operator<<(local_190,std::hex);
  std::ostream::operator<<(this,*local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static auto hexlexical_cast(const UnsignedIntegralType& u) -> std::string
    {
      std::stringstream ss;

      ss << std::hex << u;

      return ss.str();
    }